

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

void __thiscall VW::ptr_queue<example>::ptr_queue(ptr_queue<example> *this,size_t max_size)

{
  this->max_size = max_size;
  (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->object_queue).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<example_*,_std::allocator<example_*>_>::_M_initialize_map
            ((_Deque_base<example_*,_std::allocator<example_*>_> *)&this->object_queue,0);
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mut).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mut).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex + 8) = 0;
  std::condition_variable::condition_variable(&this->is_not_full);
  std::condition_variable::condition_variable(&this->is_not_empty);
  return;
}

Assistant:

ptr_queue(size_t max_size)
      : max_size(max_size)
    {}